

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O1

void jp2_cmap_dumpdata(jp2_box_t *box,FILE *out)

{
  jp2_cdefchan_t *pjVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  fprintf((FILE *)out,"numchans = %d\n",(ulong)*(uint *)&box->data);
  if ((box->data).ftyp.majver != 0) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      pjVar1 = (box->data).cdef.ents;
      fprintf((FILE *)out,"cmptno=%d; map=%d; pcol=%d\n",(ulong)(uint)(&pjVar1->channo)[uVar3 * 2],
              (ulong)(byte)(&pjVar1->type)[uVar3 * 2],
              (ulong)*(byte *)((long)&pjVar1->type + uVar3 * 0x10 + 1));
      bVar2 = uVar4 < (box->data).ftyp.majver;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

static void jp2_cmap_dumpdata(jp2_box_t *box, FILE *out)
{
	jp2_cmap_t *cmap = &box->data.cmap;
	unsigned int i;
	jp2_cmapent_t *ent;
	fprintf(out, "numchans = %d\n", (int) cmap->numchans);
	for (i = 0; i < cmap->numchans; ++i) {
		ent = &cmap->ents[i];
		fprintf(out, "cmptno=%d; map=%d; pcol=%d\n",
		  (int) ent->cmptno, (int) ent->map, (int) ent->pcol);
	}
}